

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

bool __thiscall nuraft::inmem_log_store::compact(inmem_log_store *this,ulong last_log_index)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  ulong uVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar4 = (this->start_idx_).super___atomic_base<unsigned_long>._M_i;
  if (uVar4 <= last_log_index) {
    p_Var1 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      __position._M_node = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var3 + 1) >= uVar4) {
            __position._M_node = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar4];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           (*(ulong *)(__position._M_node + 1) <= uVar4)) {
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          ::_M_erase_aux(&(this->logs_)._M_t,__position);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= last_log_index);
  }
  if ((this->start_idx_).super___atomic_base<unsigned_long>._M_i <= last_log_index) {
    LOCK();
    (this->start_idx_).super___atomic_base<unsigned_long>._M_i = last_log_index + 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  return true;
}

Assistant:

bool inmem_log_store::compact(ulong last_log_index) {
    std::lock_guard<std::mutex> l(logs_lock_);
    for (ulong ii = start_idx_; ii <= last_log_index; ++ii) {
        auto entry = logs_.find(ii);
        if (entry != logs_.end()) {
            logs_.erase(entry);
        }
    }

    // WARNING:
    //   Even though nothing has been erased,
    //   we should set `start_idx_` to new index.
    if (start_idx_ <= last_log_index) {
        start_idx_ = last_log_index + 1;
    }
    return true;
}